

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

BOOL __thiscall
Memory::Recycler::CollectWithHeuristic<(Memory::CollectionFlags)404852739>(Recycler *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  BOOL BVar6;
  uint uVar7;
  DWORD DVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  undefined8 *in_FS_OFFSET;
  
  if (this->inPartialCollectMode != false) {
    if (this->enablePartialCollect == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0xe8b,"(enablePartialCollect)","enablePartialCollect");
      if (!bVar4) goto LAB_002836bd;
      *puVar1 = 0;
    }
    if ((this->uncollectedNewPageCountPartialCollect < 0x400) ||
       ((ulong)RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount <
        this->uncollectedNewPageCountPartialCollect)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0xe8e,
                         "(this->uncollectedNewPageCountPartialCollect >= RecyclerSweepManager::MinPartialUncollectedNewPageCount && this->uncollectedNewPageCountPartialCollect <= RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount)"
                         ,
                         "this->uncollectedNewPageCountPartialCollect >= RecyclerSweepManager::MinPartialUncollectedNewPageCount && this->uncollectedNewPageCountPartialCollect <= RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount"
                        );
      if (!bVar4) {
LAB_002836bd:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
    }
    if (this->uncollectedNewPageCountPartialCollect < (this->autoHeap).uncollectedNewPageCount) {
      BVar6 = Collect<(Memory::CollectionFlags)404852739>(this);
      return BVar6;
    }
  }
  uVar10 = (this->autoHeap).uncollectedAllocBytes;
  uVar7 = RecyclerHeuristic::UncollectedAllocBytesCollection();
  if (uVar10 < uVar7) {
    (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[0x12])();
    bVar4 = this->hasDisposableObject;
    if (bVar4 == true) {
      this->allowDispose = true;
      this->inDisposeWrapper = true;
      bVar5 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,RecyclerPhase);
      if (bVar5) {
        Output::Print(L"%04X> RC(%p): %s\n",this->mainThreadId,this,
                      L"Process delayed dispose object");
      }
      (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[0xe])(this->collectionWrapper,this)
      ;
      if ((((this->collectionState).value == CollectionStateNotCollecting) &&
          (this->inExhaustiveCollection == true)) && ((this->hasExhaustiveCandidate & 1U) != 0)) {
        (this->collectionParam).priorityBoostConcurrentSweepOverride = false;
        (this->collectionParam).finishOnly = false;
        (this->collectionParam).repeat = true;
        (this->collectionParam).flags =
             CollectMode_Concurrent|CollectOverride_FinishConcurrentTimeout|
             CollectOverride_AllowReentrant|CollectNowDefaultLSCleanup|CollectHeuristic_Time|
             CollectHeuristic_AllocSize;
        (this->collectionParam).uncollectedAllocBytes = (this->autoHeap).uncollectedAllocBytes;
        (this->collectionParam).uncollectedNewPageCountPartialCollect =
             this->uncollectedNewPageCountPartialCollect;
        (this->collectionParam).inPartialCollectMode = this->inPartialCollectMode;
        sVar3 = (this->autoHeap).unusedPartialCollectFreeBytes;
        (this->collectionParam).uncollectedNewPageCount = (this->autoHeap).uncollectedNewPageCount;
        (this->collectionParam).unusedPartialCollectFreeBytes = sVar3;
        DoCollectWrapped(this,CollectMode_Concurrent|CollectOverride_FinishConcurrentTimeout|
                              CollectOverride_AllowReentrant|CollectNowDefaultLSCleanup|
                              CollectHeuristic_Time|CollectHeuristic_AllocSize);
      }
      this->inDisposeWrapper = false;
    }
    return (uint)bVar4;
  }
  uVar10 = (this->autoHeap).uncollectedAllocBytes;
  uVar9 = (ulong)RecyclerHeuristic::Instance.MaxUncollectedAllocBytes;
  DVar8 = GetTickCount();
  uVar7 = this->tickCountNextCollection;
  (this->collectionParam).timeDiff = DVar8 - uVar7;
  if (uVar10 < uVar9) {
    iVar11 = uVar7 - DVar8;
    if (-1 < iVar11) {
      (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[0x12])();
      uVar10 = (ulong)this->hasDisposableObject;
      if (this->hasDisposableObject == true) {
        this->allowDispose = true;
        this->inDisposeWrapper = true;
        bVar4 = Js::Phases::IsEnabled(&this->recyclerFlagsTable->Trace,RecyclerPhase);
        if (bVar4) {
          Output::Print(L"%04X> RC(%p): %s\n",this->mainThreadId,this,
                        L"Process delayed dispose object");
        }
        (*this->collectionWrapper->_vptr_RecyclerCollectionWrapper[0xe])
                  (this->collectionWrapper,this);
        if ((((this->collectionState).value == CollectionStateNotCollecting) &&
            (this->inExhaustiveCollection == true)) && ((this->hasExhaustiveCandidate & 1U) != 0)) {
          (this->collectionParam).priorityBoostConcurrentSweepOverride = false;
          (this->collectionParam).finishOnly = false;
          (this->collectionParam).repeat = true;
          (this->collectionParam).flags =
               CollectMode_Concurrent|CollectOverride_FinishConcurrentTimeout|
               CollectOverride_AllowReentrant|CollectNowDefaultLSCleanup|CollectHeuristic_Time|
               CollectHeuristic_AllocSize;
          (this->collectionParam).uncollectedAllocBytes = (this->autoHeap).uncollectedAllocBytes;
          (this->collectionParam).uncollectedNewPageCountPartialCollect =
               this->uncollectedNewPageCountPartialCollect;
          (this->collectionParam).inPartialCollectMode = this->inPartialCollectMode;
          sVar3 = (this->autoHeap).unusedPartialCollectFreeBytes;
          (this->collectionParam).uncollectedNewPageCount = (this->autoHeap).uncollectedNewPageCount
          ;
          (this->collectionParam).unusedPartialCollectFreeBytes = sVar3;
          DoCollectWrapped(this,CollectMode_Concurrent|CollectOverride_FinishConcurrentTimeout|
                                CollectOverride_AllowReentrant|CollectNowDefaultLSCleanup|
                                CollectHeuristic_Time|CollectHeuristic_AllocSize);
        }
        this->inDisposeWrapper = false;
      }
    }
    if (-1 < iVar11) {
      return (BOOL)uVar10;
    }
  }
  BVar6 = Collect<(Memory::CollectionFlags)270635011>(this);
  return BVar6;
}

Assistant:

BOOL
Recycler::CollectWithHeuristic()
{
    // CollectHeuristic_Never flag should only be used with exhaustive candidate
    Assert((flags & CollectHeuristic_Never) == 0);

    BOOL isScriptContextCloseGCPending = FALSE;
    const BOOL allocSize = flags & CollectHeuristic_AllocSize;
    const BOOL timedIfScriptActive = flags & CollectHeuristic_TimeIfScriptActive;
    const BOOL timedIfInScript = flags & CollectHeuristic_TimeIfInScript;
    const BOOL timed = (timedIfScriptActive && isScriptActive) || (timedIfInScript && isInScript) || (flags & CollectHeuristic_Time);

    if ((flags & CollectOverride_CheckScriptContextClose) != 0)
    {
        isScriptContextCloseGCPending = this->collectionWrapper->GetIsScriptContextCloseGCPending();
    }

    // If there is a script context close GC pending, we need to do a GC regardless
    // Otherwise, we should check the heuristics to see if a GC is necessary
    if (!isScriptContextCloseGCPending)
    {
#if ENABLE_PARTIAL_GC
        if (GetPartialFlag<flags>())
        {
            Assert(enablePartialCollect);
            Assert(allocSize);
            Assert(this->uncollectedNewPageCountPartialCollect >= RecyclerSweepManager::MinPartialUncollectedNewPageCount
                && this->uncollectedNewPageCountPartialCollect <= RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount);

            // PARTIAL-GC-REVIEW: For now, we have only alloc size heuristic
            // Maybe improve this heuristic by looking at how many free pages are in the page allocator.
            if (autoHeap.uncollectedNewPageCount > this->uncollectedNewPageCountPartialCollect)
            {
#ifdef ENABLE_JS_ETW
                if (IS_UNKNOWN_GC_TRIGGER(collectionStartReason))
                {
                    collectionStartReason = ETWEventGCActivationTrigger::ETWEvent_GC_Trigger_Partial_GC_AllocSize_Heuristic;
                }
#endif
                return Collect<flags>();
            }
        }
#endif

        // allocation byte count heuristic, collect every 1 MB allocated
        if (allocSize && (autoHeap.uncollectedAllocBytes < RecyclerHeuristic::UncollectedAllocBytesCollection()))
        {
            return FinishDisposeObjectsWrapped<flags>();
        }

        // time heuristic, allocate every 1000 clock tick, or 64 MB is allocated in a short time
        if (timed && (autoHeap.uncollectedAllocBytes < RecyclerHeuristic::Instance.MaxUncollectedAllocBytes))
        {
            uint currentTickCount = GetTickCount();
#ifdef RECYCLER_TRACE
            collectionParam.timeDiff = currentTickCount - tickCountNextCollection;
#endif
            if ((int)(tickCountNextCollection - currentTickCount) >= 0)
            {
                return FinishDisposeObjectsWrapped<flags>();
            }
        }
#ifdef RECYCLER_TRACE
        else
        {
            uint currentTickCount = GetTickCount();
            collectionParam.timeDiff = currentTickCount - tickCountNextCollection;
        }
#endif
    }

    // Passed all the heuristic, do some GC work, maybe
    return Collect<(CollectionFlags)(flags & ~CollectMode_Partial)>();
}